

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void Reverse(uint8_t *v,size_t start,size_t end)

{
  uint8_t uVar1;
  ulong uStack_20;
  uint8_t tmp;
  size_t end_local;
  size_t start_local;
  uint8_t *v_local;
  
  uStack_20 = end - 1;
  for (end_local = start; end_local < uStack_20; end_local = end_local + 1) {
    uVar1 = v[end_local];
    v[end_local] = v[uStack_20];
    v[uStack_20] = uVar1;
    uStack_20 = uStack_20 - 1;
  }
  return;
}

Assistant:

static void Reverse(uint8_t* v, size_t start, size_t end) {
  --end;
  while (start < end) {
    uint8_t tmp = v[start];
    v[start] = v[end];
    v[end] = tmp;
    ++start;
    --end;
  }
}